

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O1

int alsa_update_nonstream_voice(ALLEGRO_VOICE *voice,void **buf,int *bytes)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ALLEGRO_PLAYMODE AVar5;
  uint *puVar6;
  ALLEGRO_SAMPLE_INSTANCE *pAVar7;
  int iVar8;
  
  puVar6 = (uint *)voice->extra;
  uVar2 = *puVar6;
  iVar8 = voice->attached_stream->pos * uVar2;
  uVar3 = puVar6[1];
  *buf = (void *)((long)iVar8 + (long)(voice->attached_stream->spl_data).buffer.f32);
  uVar4 = *bytes;
  if ((char)puVar6[4] != '\0') {
    if (iVar8 < (int)uVar4) {
      *bytes = iVar8;
      pAVar7 = voice->attached_stream;
      pAVar7->pos = 0;
      *(undefined1 *)(puVar6 + 4) = 0;
      return (int)pAVar7;
    }
    pAVar7 = (ALLEGRO_SAMPLE_INSTANCE *)((ulong)uVar4 / (ulong)uVar2);
    piVar1 = &voice->attached_stream->pos;
    *piVar1 = *piVar1 - (int)pAVar7;
LAB_001111dd:
    return (int)pAVar7;
  }
  if ((int)(uVar4 + iVar8) <= (int)(uVar3 * uVar2)) {
    piVar1 = &voice->attached_stream->pos;
    *piVar1 = *piVar1 + uVar4 / uVar2;
    return uVar4 / uVar2;
  }
  *bytes = uVar3 * uVar2 - iVar8;
  pAVar7 = voice->attached_stream;
  AVar5 = pAVar7->loop;
  if (AVar5 == ALLEGRO_PLAYMODE_BIDIR) {
    *(undefined1 *)(puVar6 + 4) = 1;
    pAVar7->pos = puVar6[1];
    return (int)pAVar7;
  }
  if (AVar5 != ALLEGRO_PLAYMODE_LOOP) {
    if (AVar5 != ALLEGRO_PLAYMODE_ONCE) goto LAB_001111dd;
    *(undefined1 *)((long)puVar6 + 0x11) = 1;
  }
  pAVar7->pos = 0;
  return (int)pAVar7;
}

Assistant:

static int alsa_update_nonstream_voice(ALLEGRO_VOICE *voice, void **buf, int *bytes)
{
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;
   int bpos = voice->attached_stream->pos * alsa_voice->frame_size;
   int blen = alsa_voice->len * alsa_voice->frame_size;

   *buf = (char *)voice->attached_stream->spl_data.buffer.ptr + bpos;

   if (!alsa_voice->reversed) {
      if (bpos + *bytes > blen) {
         *bytes = blen - bpos;
         if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_ONCE) {
            alsa_voice->stop = true;
            voice->attached_stream->pos = 0;
         }
         if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_LOOP) {
            voice->attached_stream->pos = 0;
         }
         else if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_BIDIR) {
            alsa_voice->reversed = true;
            voice->attached_stream->pos = alsa_voice->len;
         }
         return 1;
      }
      else
         voice->attached_stream->pos += *bytes / alsa_voice->frame_size;
   }
   else {
      if (bpos - *bytes < 0) {
         *bytes = bpos;
         /* loop will be ALLEGRO_PLAYMODE_BIDIR, other playing modes that play
            backwards are not currently supported by the API */
         /*if (voice->attached_stream->loop != ALLEGRO_PLAYMODE_BIDIR)
            alsa_voice->stop = true;*/

         voice->attached_stream->pos = 0;
         alsa_voice->reversed = false;
         return 1;
      }
      else
         voice->attached_stream->pos -= *bytes / alsa_voice->frame_size;
   }

   return 0;
}